

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O1

bool bssl::ssl_setup_pake_shares(SSL_HANDSHAKE *hs)

{
  long *plVar1;
  CERT *pCVar2;
  long *plVar3;
  ulong uVar4;
  SSL_CREDENTIAL *cred;
  Span<const_unsigned_char> id_prover;
  Span<const_unsigned_char> context;
  Span<const_unsigned_char> id_verifier;
  Span<const_unsigned_char> w0;
  Span<const_unsigned_char> w1;
  bool bVar5;
  int iVar6;
  pointer __p;
  Prover *pPVar7;
  long *plVar8;
  long *plVar9;
  long lVar10;
  pointer __p_1;
  Span<unsigned_char> out_share;
  ScopedCBB cbb;
  CBB shares;
  uint8_t prover_share [65];
  CBB pake_message;
  CBB server_identity;
  CBB client_identity;
  CBB local_178;
  undefined8 local_148;
  undefined8 uStack_140;
  CBB local_138;
  __uniq_ptr_impl<bssl::spake2plus::Prover,_bssl::internal::Deleter> local_108 [10];
  CBB local_b8;
  CBB local_88;
  CBB local_58;
  
  OPENSSL_free((hs->pake_share_bytes).data_);
  (hs->pake_share_bytes).data_ = (uchar *)0x0;
  (hs->pake_share_bytes).size_ = 0;
  bVar5 = true;
  if (hs->max_version < 0x304) {
    return true;
  }
  pCVar2 = (hs->config->cert)._M_t.super___uniq_ptr_impl<bssl::CERT,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_bssl::CERT_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_bssl::CERT_*,_false>._M_head_impl;
  plVar3 = (long *)(pCVar2->credentials).data_;
  uVar4 = (pCVar2->credentials).size_;
  plVar1 = plVar3 + uVar4;
  plVar8 = plVar3;
  if (0 < (long)uVar4 >> 2) {
    plVar8 = plVar3 + (uVar4 & 0xfffffffffffffffc);
    lVar10 = ((long)uVar4 >> 2) + 1;
    plVar9 = plVar3 + 2;
    do {
      if (*(int *)(plVar9[-2] + 4) == 2) {
        plVar9 = plVar9 + -2;
        goto LAB_0013965b;
      }
      if (*(int *)(plVar9[-1] + 4) == 2) {
        plVar9 = plVar9 + -1;
        goto LAB_0013965b;
      }
      if (*(int *)(*plVar9 + 4) == 2) goto LAB_0013965b;
      if (*(int *)(plVar9[1] + 4) == 2) {
        plVar9 = plVar9 + 1;
        goto LAB_0013965b;
      }
      lVar10 = lVar10 + -1;
      plVar9 = plVar9 + 4;
    } while (1 < lVar10);
  }
  lVar10 = (long)plVar1 - (long)plVar8 >> 3;
  if (lVar10 != 1) {
    if (lVar10 != 2) {
      plVar9 = plVar1;
      if ((lVar10 != 3) || (plVar9 = plVar8, *(int *)(*plVar8 + 4) == 2)) goto LAB_0013965b;
      plVar8 = plVar8 + 1;
    }
    plVar9 = plVar8;
    if (*(int *)(*plVar8 + 4) == 2) goto LAB_0013965b;
    plVar8 = plVar8 + 1;
  }
  plVar9 = plVar8;
  if (*(int *)(*plVar8 + 4) != 2) {
    plVar9 = plVar1;
  }
LAB_0013965b:
  if (plVar9 != plVar1) {
    if (uVar4 == 1) {
      cred = (SSL_CREDENTIAL *)*plVar3;
      if (cred->type != kSPAKE2PlusV1Client) {
        __assert_fail("cred->type == SSLCredentialType::kSPAKE2PlusV1Client",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0xc16,"bool bssl::ssl_setup_pake_shares(SSL_HANDSHAKE *)");
      }
      pPVar7 = New<bssl::spake2plus::Prover>();
      local_108[0]._M_t.super__Tuple_impl<0UL,_bssl::spake2plus::Prover_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bssl::spake2plus::Prover_*,_false>._M_head_impl =
           (tuple<bssl::spake2plus::Prover_*,_bssl::internal::Deleter>)
           (_Tuple_impl<0UL,_bssl::spake2plus::Prover_*,_bssl::internal::Deleter>)0x0;
      std::__uniq_ptr_impl<bssl::spake2plus::Prover,_bssl::internal::Deleter>::reset
                ((__uniq_ptr_impl<bssl::spake2plus::Prover,_bssl::internal::Deleter> *)
                 &hs->pake_prover,pPVar7);
      std::unique_ptr<bssl::spake2plus::Prover,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<bssl::spake2plus::Prover,_bssl::internal::Deleter> *)local_108);
      pPVar7 = (hs->pake_prover)._M_t.
               super___uniq_ptr_impl<bssl::spake2plus::Prover,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_bssl::spake2plus::Prover_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_bssl::spake2plus::Prover_*,_false>._M_head_impl;
      if (pPVar7 != (Prover *)0x0) {
        context.data_ = (cred->pake_context).data_;
        context.size_ = (cred->pake_context).size_;
        id_prover.data_ = (cred->client_identity).data_;
        id_prover.size_ = (cred->client_identity).size_;
        id_verifier.data_ = (cred->server_identity).data_;
        id_verifier.size_ = (cred->server_identity).size_;
        w0.data_ = (cred->password_verifier_w0).data_;
        w0.size_ = (cred->password_verifier_w0).size_;
        w1.data_ = (cred->password_verifier_w1).data_;
        w1.size_ = (cred->password_verifier_w1).size_;
        local_148 = 0;
        uStack_140 = 0;
        bVar5 = spake2plus::Prover::Init
                          (pPVar7,context,id_prover,id_verifier,w0,w1,
                           (Span<const_unsigned_char>)ZEXT816(0));
        if ((bVar5) &&
           (out_share.size_ = 0x41, out_share.data_ = (uchar *)local_108,
           bVar5 = spake2plus::Prover::GenerateShare
                             ((hs->pake_prover)._M_t.
                              super___uniq_ptr_impl<bssl::spake2plus::Prover,_bssl::internal::Deleter>
                              ._M_t.
                              super__Tuple_impl<0UL,_bssl::spake2plus::Prover_*,_bssl::internal::Deleter>
                              .super__Head_base<0UL,_bssl::spake2plus::Prover_*,_false>._M_head_impl
                              ,out_share), bVar5)) {
          if (cred != (SSL_CREDENTIAL *)0x0) {
            SSL_CREDENTIAL_up_ref(cred);
          }
          local_178.child = (CBB *)0x0;
          std::__uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>::reset
                    ((__uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter> *)&hs->credential,
                     cred);
          std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<ssl_credential_st,_bssl::internal::Deleter> *)&local_178);
          CBB_zero(&local_178);
          iVar6 = CBB_init(&local_178,0x40);
          if ((((((iVar6 == 0) ||
                 (iVar6 = CBB_add_u16_length_prefixed(&local_178,&local_58), iVar6 == 0)) ||
                (iVar6 = CBB_add_bytes(&local_58,(cred->client_identity).data_,
                                       (cred->client_identity).size_), iVar6 == 0)) ||
               ((iVar6 = CBB_add_u16_length_prefixed(&local_178,&local_88), iVar6 == 0 ||
                (iVar6 = CBB_add_bytes(&local_88,(cred->server_identity).data_,
                                       (cred->server_identity).size_), iVar6 == 0)))) ||
              ((iVar6 = CBB_add_u16_length_prefixed(&local_178,&local_138), iVar6 == 0 ||
               ((iVar6 = CBB_add_u16(&local_138,0x7d96), iVar6 == 0 ||
                (iVar6 = CBB_add_u16_length_prefixed(&local_138,&local_b8), iVar6 == 0)))))) ||
             (iVar6 = CBB_add_bytes(&local_b8,(uint8_t *)local_108,0x41), iVar6 == 0)) {
            bVar5 = false;
          }
          else {
            bVar5 = CBBFinishArray(&local_178,&hs->pake_share_bytes);
          }
          CBB_cleanup(&local_178);
          return bVar5;
        }
      }
      bVar5 = false;
    }
    else {
      bVar5 = false;
      ERR_put_error(0x10,0,0x147,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0xc12);
    }
  }
  return bVar5;
}

Assistant:

bool ssl_setup_pake_shares(SSL_HANDSHAKE *hs) {
  hs->pake_share_bytes.Reset();
  if (hs->max_version < TLS1_3_VERSION) {
    return true;
  }

  const auto &creds = hs->config->cert->credentials;
  if (std::none_of(creds.begin(), creds.end(), [](const auto &cred) {
        return cred->type == SSLCredentialType::kSPAKE2PlusV1Client;
      })) {
    // If there were no configured PAKE credentials, proceed without filling
    // in the PAKE extension.
    return true;
  }

  // We currently do not support multiple PAKE credentials, or a mix of PAKE and
  // non-PAKE credentials.
  if (creds.size() != 1u) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_UNSUPPORTED_CREDENTIAL_LIST);
    return false;
  }
  SSL_CREDENTIAL *cred = creds[0].get();
  assert(cred->type == SSLCredentialType::kSPAKE2PlusV1Client);

  hs->pake_prover = MakeUnique<spake2plus::Prover>();
  uint8_t prover_share[spake2plus::kShareSize];
  if (hs->pake_prover == nullptr ||
      !hs->pake_prover->Init(cred->pake_context, cred->client_identity,
                             cred->server_identity, cred->password_verifier_w0,
                             cred->password_verifier_w1) ||
      !hs->pake_prover->GenerateShare(prover_share)) {
    return false;
  }

  hs->credential = UpRef(cred);

  bssl::ScopedCBB cbb;
  CBB shares, client_identity, server_identity, pake_message;
  if (!CBB_init(cbb.get(), 64) ||
      !CBB_add_u16_length_prefixed(cbb.get(), &client_identity) ||
      !CBB_add_bytes(&client_identity, cred->client_identity.data(),
                     cred->client_identity.size()) ||
      !CBB_add_u16_length_prefixed(cbb.get(), &server_identity) ||
      !CBB_add_bytes(&server_identity, cred->server_identity.data(),
                     cred->server_identity.size()) ||
      !CBB_add_u16_length_prefixed(cbb.get(), &shares) ||
      !CBB_add_u16(&shares, SSL_PAKE_SPAKE2PLUSV1) ||
      !CBB_add_u16_length_prefixed(&shares, &pake_message) ||
      !CBB_add_bytes(&pake_message, prover_share, sizeof(prover_share))) {
    return false;
  }

  return CBBFinishArray(cbb.get(), &hs->pake_share_bytes);
}